

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

CURLcode file_do(Curl_easy *data,_Bool *done)

{
  uint uVar1;
  FILEPROTO *pFVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  __off64_t _Var11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  curl_off_t __offset;
  long lVar19;
  char *pcVar20;
  bool bVar21;
  curltime cVar22;
  tm buffer;
  char accept_ranges [24];
  char header [80];
  stat statbuf;
  
  pcVar15 = (data->state).buffer;
  *done = true;
  Curl_pgrsStartNow(data);
  pFVar2 = (data->req).p.file;
  if (((data->set).field_0x8e5 & 4) == 0) {
    iVar8 = pFVar2->fd;
    iVar5 = fstat64(iVar8,(stat64 *)&statbuf);
    if (iVar5 == -1) {
      lVar18 = -1;
    }
    else {
      lVar18 = statbuf.st_size;
      if ((statbuf.st_mode & 0xf000) == 0x4000) {
        lVar18 = -1;
      }
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != '\0')) &&
         (_Var4 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
      builtin_strncpy(accept_ranges,"Accept-ranges: bytes\r\n",0x17);
      accept_ranges[0x17] = '\0';
      if (-1 < lVar18) {
        iVar6 = curl_msnprintf(header,0x50,"Content-Length: %ld\r\n",lVar18);
        CVar7 = Curl_client_write(data,2,header,(long)iVar6);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        sVar10 = strlen(accept_ranges);
        CVar7 = Curl_client_write(data,2,accept_ranges,sVar10);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
      }
      CVar7 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      iVar6 = 6;
      if (buffer.tm_wday != 0) {
        iVar6 = buffer.tm_wday + -1;
      }
      pcVar20 = "";
      if ((*(uint *)&(data->set).field_0x8e2 >> 0x19 & 1) == 0) {
        pcVar20 = "\r\n";
      }
      iVar6 = curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
                             Curl_wkday[iVar6],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon]
                             ,(ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                             (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec,pcVar20);
      CVar7 = Curl_client_write(data,2,header,(long)iVar6);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      Curl_pgrsSetDownloadSize(data,lVar18);
      if ((*(uint *)&(data->set).field_0x8e2 >> 0x19 & 1) != 0) {
        return CURLE_OK;
      }
    }
    CVar7 = Curl_range(data);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    __offset = (data->state).resume_from;
    if (__offset < 0) {
      if (iVar5 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      __offset = __offset + statbuf.st_size;
      (data->state).resume_from = __offset;
    }
    lVar19 = lVar18;
    if ((__offset < 1) || (lVar19 = lVar18 - __offset, __offset <= lVar18)) {
      bVar21 = iVar5 != -1;
      lVar18 = (data->req).maxdownload;
      if (0 < lVar18) {
        lVar19 = lVar18;
      }
      bVar3 = 0 < lVar19;
      if (bVar3 && bVar21) {
        Curl_pgrsSetDownloadSize(data,lVar19);
        __offset = (data->state).resume_from;
      }
      if ((__offset == 0) || (_Var11 = lseek64(iVar8,__offset,0), __offset == _Var11)) {
        Curl_pgrsTime(data,TIMER_STARTTRANSFER);
        lVar18 = 0;
        CVar7 = CURLE_OK;
        while (CVar7 == CURLE_OK) {
          uVar1 = (data->set).buffer_size;
          sVar12 = (size_t)uVar1;
          if (bVar3 && bVar21) {
            if (lVar19 < (long)sVar12) {
              sVar12 = curlx_sotouz(lVar19);
            }
          }
          else {
            sVar12 = (size_t)(uVar1 - 1);
          }
          sVar12 = read(iVar8,pcVar15,sVar12);
          if (0 < (long)sVar12) {
            pcVar15[sVar12] = '\0';
          }
          if (((long)sVar12 < 1) || (lVar19 == 0 && (bVar3 && bVar21))) break;
          sVar16 = 0;
          if (bVar3 && bVar21) {
            sVar16 = sVar12;
          }
          CVar7 = Curl_client_write(data,1,pcVar15,sVar12);
          if (CVar7 != CURLE_OK) {
            return CVar7;
          }
          lVar18 = lVar18 + sVar12;
          lVar19 = lVar19 - sVar16;
          Curl_pgrsSetDownloadCounter(data,lVar18);
          iVar5 = Curl_pgrsUpdate(data);
          CVar7 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar5 == 0) {
            cVar22 = Curl_now();
            CVar7 = Curl_speedcheck(data,cVar22);
          }
        }
        iVar8 = Curl_pgrsUpdate(data);
        if (iVar8 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar7;
      }
    }
    else {
      Curl_failf(data,"failed to resume file:// transfer");
    }
    return CURLE_BAD_DOWNLOAD_RESUME;
  }
  pcVar15 = pFVar2->path;
  pcVar9 = strchr(pcVar15,0x2f);
  pcVar20 = (data->state).buffer;
  (data->req).upload_fromhere = pcVar20;
  if (pcVar9 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar9[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar8 = open64(pcVar15,(uint)((data->state).resume_from != 0) * 0x200 + 0x241,
                 (ulong)(data->set).new_file_perms);
  if (iVar8 < 0) {
    pcVar15 = pFVar2->path;
    pcVar20 = "Can\'t open %s for writing";
LAB_004b0ec6:
    Curl_failf(data,pcVar20,pcVar15);
    CVar7 = CURLE_WRITE_ERROR;
  }
  else {
    lVar18 = (data->state).infilesize;
    if (lVar18 != -1) {
      Curl_pgrsSetUploadSize(data,lVar18);
    }
    if ((data->state).resume_from < 0) {
      iVar5 = fstat64(iVar8,(stat64 *)&statbuf);
      if (iVar5 != 0) {
        close(iVar8);
        pcVar15 = pFVar2->path;
        pcVar20 = "Can\'t get the size of %s";
        goto LAB_004b0ec6;
      }
      (data->state).resume_from = statbuf.st_size;
    }
    lVar18 = 0;
    CVar7 = CURLE_OK;
    while( true ) {
      if ((CVar7 != CURLE_OK) ||
         (CVar7 = Curl_fillreadbuffer(data,(ulong)(data->set).buffer_size,(size_t *)header),
         CVar7 != CURLE_OK)) goto LAB_004b1026;
      if (header._0_8_ == 0) break;
      lVar19 = (data->state).resume_from;
      pcVar15 = pcVar20;
      sVar10 = header._0_8_;
      if (lVar19 != 0) {
        sVar13 = header._0_8_ - lVar19;
        lVar17 = 0;
        if (sVar13 != 0 && lVar19 <= (long)header._0_8_) {
          lVar17 = lVar19;
        }
        sVar10 = 0;
        if (sVar13 != 0 && lVar19 <= (long)header._0_8_) {
          sVar10 = sVar13;
        }
        lVar14 = -sVar13;
        if (lVar19 < (long)header._0_8_) {
          lVar14 = 0;
        }
        (data->state).resume_from = lVar14;
        pcVar15 = pcVar20 + lVar17;
      }
      sVar13 = write(iVar8,pcVar15,sVar10);
      if (sVar13 != sVar10) {
        CVar7 = CURLE_SEND_ERROR;
        goto LAB_004b1026;
      }
      lVar18 = lVar18 + sVar10;
      Curl_pgrsSetUploadCounter(data,lVar18);
      iVar5 = Curl_pgrsUpdate(data);
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar5 == 0) {
        cVar22 = Curl_now();
        CVar7 = Curl_speedcheck(data,cVar22);
      }
    }
    iVar5 = Curl_pgrsUpdate(data);
    CVar7 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar5 == 0) {
      CVar7 = CURLE_OK;
    }
LAB_004b1026:
    close(iVar8);
  }
  return CVar7;
}

Assistant:

static CURLcode file_do(struct Curl_easy *data, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = -1;
  bool size_known;
  bool fstated = FALSE;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(data);

  file = data->req.p.file;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    if(!S_ISDIR(statbuf.st_mode))
      expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    int headerlen;
    char accept_ranges[24]= { "Accept-ranges: bytes\r\n" };
    if(expected_size >= 0) {
      headerlen = msnprintf(header, sizeof(header),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
                expected_size);
      result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
      if(result)
        return result;

      result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                 accept_ranges, strlen(accept_ranges));
      if(result != CURLE_OK)
        return result;
    }

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    headerlen = msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(data);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from > 0) {
    /* We check explicitly if we have a start offset, because
     * expected_size may be -1 if we don't know how large the file is,
     * in which case we should not adjust it. */
    if(data->state.resume_from <= expected_size)
      expected_size -= data->state.resume_from;
    else {
      failf(data, "failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size <= 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(size_known)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(data, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}